

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdantzigpr.hpp
# Opt level: O3

SPxId __thiscall
soplex::SPxDantzigPR<double>::selectEnterSparseDim
          (SPxDantzigPR<double> *this,double *best,SPxId *enterId)

{
  double dVar1;
  int i;
  int iVar2;
  SPxSolverBase<double> *this_00;
  int *piVar3;
  DataKey DVar4;
  long lVar5;
  ulong uVar6;
  
  lVar5 = (long)(((this->super_SPxPricer<double>).thesolver)->infeasibilities).super_IdxSet.num;
  if (0 < lVar5) {
    uVar6 = lVar5 + 1;
    do {
      this_00 = (this->super_SPxPricer<double>).thesolver;
      piVar3 = (this_00->infeasibilities).super_IdxSet.idx;
      i = piVar3[uVar6 - 2];
      dVar1 = (this_00->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[i];
      if (-(this->super_SPxPricer<double>).thetolerance <= dVar1) {
        iVar2 = (this_00->infeasibilities).super_IdxSet.num;
        (this_00->infeasibilities).super_IdxSet.num = iVar2 + -1;
        piVar3[uVar6 - 2] = piVar3[(long)iVar2 + -1];
        (this_00->isInfeasible).data[i] = 0;
      }
      else if (dVar1 < *best) {
        DVar4 = (DataKey)SPxSolverBase<double>::coId(this_00,i);
        enterId->super_DataKey = DVar4;
        *best = dVar1;
      }
      uVar6 = uVar6 - 1;
    } while (1 < uVar6);
  }
  return (SPxId)enterId->super_DataKey;
}

Assistant:

SPxId SPxDantzigPR<R>::selectEnterSparseDim(R& best, SPxId& enterId)
{
   assert(this->thesolver != nullptr);

   int idx;
   R x;

   for(int i = this->thesolver->infeasibilities.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->infeasibilities.index(i);
      x = this->thesolver->coTest()[idx];

      if(x < -this->thetolerance)
      {
         if(x < best)
         {
            enterId = this->thesolver->coId(idx);
            best = x;
         }
      }
      else
      {
         this->thesolver->infeasibilities.remove(i);

         assert(this->thesolver->isInfeasible[idx]);
         this->thesolver->isInfeasible[idx] = 0;
      }
   }

   return enterId;
}